

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

UBool __thiscall icu_63::UnicodeSet::operator==(UnicodeSet *this,UnicodeSet *o)

{
  UBool UVar1;
  int local_24;
  int32_t i;
  UnicodeSet *o_local;
  UnicodeSet *this_local;
  
  if (this->len == o->len) {
    for (local_24 = 0; local_24 < this->len; local_24 = local_24 + 1) {
      if (this->list[local_24] != o->list[local_24]) {
        return '\0';
      }
    }
    UVar1 = UVector::operator!=(this->strings,o->strings);
    if (UVar1 == '\0') {
      this_local._7_1_ = '\x01';
    }
    else {
      this_local._7_1_ = '\0';
    }
  }
  else {
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UBool UnicodeSet::operator==(const UnicodeSet& o) const {
    if (len != o.len) return FALSE;
    for (int32_t i = 0; i < len; ++i) {
        if (list[i] != o.list[i]) return FALSE;
    }
    if (*strings != *o.strings) return FALSE;
    return TRUE;
}